

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.cpp
# Opt level: O3

bool ReadDO(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *path;
  Data *data;
  FILE *__stream;
  Format fmt;
  char **local_90 [2];
  char *local_80 [2];
  Format local_6c;
  
  Format::Format(&local_6c,DO);
  iVar3 = MemFile::size(file);
  iVar4 = Format::disk_size(&local_6c);
  if (iVar3 == iVar4) {
    path = MemFile::name_abi_cxx11_(file);
    __stream = (FILE *)local_90;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)__stream,"do","");
    bVar2 = IsFileExt(path,(string *)__stream);
    if (local_90[0] != local_80) {
      __stream = (FILE *)(local_80[0] + 1);
      operator_delete(local_90[0],(ulong)__stream);
    }
    if (bVar2) {
      MemFile::rewind(file,__stream);
      this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      data = MemFile::data(file);
      Disk::format(this,&local_6c,data,false);
      peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::_M_replace
                ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b0db6);
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadDO(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt{ RegularFormat::DO };

    // For now, rely on the file size and extension
    if (file.size() != fmt.disk_size() || !IsFileExt(file.name(), "do"))
        return false;

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "DO";

    return true;
}